

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::moveFromDataSpace(Forth *this,string *dst,Cell src,size_t count)

{
  pointer pcVar1;
  size_type sVar2;
  Char CVar3;
  size_type sVar4;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize(dst,count)
  ;
  pcVar1 = (dst->_M_dataplus)._M_p;
  sVar2 = dst->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    CVar3 = dataSpaceAt(this,src + (int)sVar4);
    pcVar1[sVar4] = CVar3;
  }
  return;
}

Assistant:

void moveFromDataSpace(std::string &dst, Cell src, size_t count){
			dst.resize(count);
			for(auto &c : dst) c=dataSpaceAt(src++);
		}